

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O1

bool __thiscall testing::internal::MatchMatrix::NextGraph(MatchMatrix *this)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  bVar5 = this->num_elements_ != 0;
  if (bVar5) {
    uVar2 = 0;
    do {
      bVar6 = this->num_matchers_ != 0;
      if (bVar6) {
        lVar3 = this->num_matchers_ * uVar2;
        pcVar1 = (this->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar7 = pcVar1[lVar3] == '\0';
        pcVar1[lVar3] = bVar7;
        if (!bVar7) {
          uVar4 = 1;
          do {
            bVar6 = uVar4 < this->num_matchers_;
            if (!bVar6) goto LAB_001f3dae;
            lVar3 = this->num_matchers_ * uVar2;
            pcVar1 = (this->matched_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar7 = pcVar1[uVar4 + lVar3] == '\0';
            pcVar1[uVar4 + lVar3] = bVar7;
            uVar4 = uVar4 + 1;
          } while (!bVar7);
        }
        if (bVar6) {
          return bVar5;
        }
      }
LAB_001f3dae:
      uVar2 = uVar2 + 1;
      bVar5 = uVar2 < this->num_elements_;
    } while (bVar5);
  }
  return bVar5;
}

Assistant:

bool MatchMatrix::NextGraph() {
  for (size_t ilhs = 0; ilhs < LhsSize(); ++ilhs) {
    for (size_t irhs = 0; irhs < RhsSize(); ++irhs) {
      char& b = matched_[SpaceIndex(ilhs, irhs)];
      if (!b) {
        b = 1;
        return true;
      }
      b = 0;
    }
  }
  return false;
}